

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O3

bool __thiscall cvm::BasicValue::operator==(BasicValue *this,BasicValue *RHS)

{
  size_t __n;
  int iVar1;
  bool bVar2;
  
  if (this->Type != RHS->Type) {
    return false;
  }
  switch(this->Type) {
  case BoolType:
    bVar2 = (this->field_2).BoolVal == (RHS->field_2).BoolVal;
    break;
  case IntType:
    bVar2 = (this->field_2).IntVal == (RHS->field_2).IntVal;
    break;
  case DoubleType:
    return (bool)(-((RHS->field_2).DoubleVal == (this->field_2).DoubleVal) & 1);
  case StringType:
    __n = (this->StrVal)._M_string_length;
    if (__n != (RHS->StrVal)._M_string_length) {
      return false;
    }
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp((this->StrVal)._M_dataplus._M_p,(RHS->StrVal)._M_dataplus._M_p,__n);
    return iVar1 == 0;
  case VoidType:
    return true;
  default:
    return false;
  }
  return bVar2;
}

Assistant:

bool BasicValue::operator==(const BasicValue &RHS) const {
  if (Type != RHS.Type)
    return false;
  switch (Type) {
  case BoolType:
    return BoolVal == RHS.BoolVal;
  case IntType:
    return IntVal == RHS.IntVal;
  case DoubleType:
    return DoubleVal == RHS.DoubleVal;
  case StringType:
    return StrVal == RHS.StrVal;
  case VoidType:
    return true;
  default:
    return false;
  }
}